

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O1

int32_t ll_get_gateway_scan_results
                  (llabs_gateway_scan_results_t (*scan_results) [16],uint8_t *num_gw)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t unaff_EBP;
  uint8_t gw;
  llabs_gateway_scan_results_t scan_result;
  byte local_36;
  llabs_gateway_scan_results_t local_35;
  
  local_36 = 0;
  *num_gw = '\0';
  while( true ) {
    iVar1 = ll_poll_scan_result(&local_35,&local_36);
    iVar2 = iVar1;
    if (iVar1 == 0) {
      if (*num_gw == '\0') {
        *num_gw = local_36 + 1;
      }
      *(ulong *)((long)&(*scan_results)[local_36].id + 5) =
           CONCAT53(local_35._8_5_,local_35.id._5_3_);
      (*scan_results)[local_36].id = CONCAT35(local_35.id._5_3_,(undefined5)local_35.id);
      iVar2 = unaff_EBP;
    }
    if (iVar1 != 0) break;
    unaff_EBP = iVar2;
    if (local_36 == 0) {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

int32_t ll_get_gateway_scan_results(llabs_gateway_scan_results_t (*scan_results)[MAX_GW_SCAN_RESULTS],
                            uint8_t *num_gw)
{
    uint8_t gw=0;
    *num_gw = 0;

    do
    {
        llabs_gateway_scan_results_t scan_result;

        int32_t ret = ll_poll_scan_result(&scan_result, &gw);
        // if scanning will return a NACK_BUSY (6)
        // if done scanning, but no gateways will return NACK_NO_DATA but no paylaod
        // if done scanning, and gateway, will return LL_IFC_ACK and gw will be an index (0-?) 
        //  and decrement each time called until gw is zero.  Zero is a valid gateway index and last
        // one in the list.
        //
        if (ret != LL_IFC_ACK)
        {
            return ret;
        }

        // When num_gw is uninitialized, we need to set it with the total
        // amount of gateways.  The interface decrements num_gw to use as an index prior to 
        // sending so we need to add one for number.
        //
        if (*num_gw == 0)
        {
            *num_gw = gw + 1;
        }

        memcpy(&(*scan_results)[gw], &scan_result, sizeof(scan_result));

    } while (gw > 0);

    return LL_IFC_ACK;
}